

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::FunctionDeclarationSyntax::setChild
          (FunctionDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_008c2190 + *(int *)(&DAT_008c2190 + index * 4)))();
  return;
}

Assistant:

void FunctionDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: prototype = child.node() ? &child.node()->as<FunctionPrototypeSyntax>() : nullptr; return;
        case 2: semi = child.token(); return;
        case 3: items = child.node()->as<SyntaxList<SyntaxNode>>(); return;
        case 4: end = child.token(); return;
        case 5: endBlockName = child.node() ? &child.node()->as<NamedBlockClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}